

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessor.cpp
# Opt level: O1

bool __thiscall
solitaire::events::EventsProcessor::tryAddCardOnFoundationPileIfCollidesAndCheckIfHandEmpty
          (EventsProcessor *this,PileId *id,MouseLeftButtonUpEventData *eventData)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  bool bVar3;
  
  iVar2 = (*this->context->_vptr_Context[6])();
  cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x18))
                    ((long *)CONCAT44(extraout_var,iVar2),&eventData->cardsInHandPosition);
  if (cVar1 == '\0') {
    bVar3 = false;
  }
  else {
    (*eventData->solitaire->_vptr_Solitaire[6])();
    bVar3 = (eventData->cardsInHand->
            super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
            _M_impl.super__Vector_impl_data._M_start ==
            (eventData->cardsInHand->
            super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  }
  return bVar3;
}

Assistant:

bool EventsProcessor::tryAddCardOnFoundationPileIfCollidesAndCheckIfHandEmpty(
    const PileId id, const MouseLeftButtonUpEventData& eventData) const
{
    const auto& collider = context.getFoundationPileCollider(id);
    return collider.collidesWithCardsInHand(eventData.cardsInHandPosition) and
           tryAddCardOnFoundationPileAndCheckIfHandEmpty(id, eventData);
}